

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugLogV(char *fmt,__va_list_tag *args)

{
  ImGuiTextBuffer *this;
  int iVar1;
  ImGuiContext *pIVar2;
  char *pcVar3;
  int iVar4;
  
  pIVar2 = GImGui;
  this = &GImGui->DebugLogBuf;
  iVar1 = (GImGui->DebugLogBuf).Buf.Size;
  iVar4 = iVar1 + -1;
  if (iVar1 == 0) {
    iVar4 = 0;
  }
  ImGuiTextBuffer::appendf(this,"[%05d] ",(ulong)(uint)GImGui->FrameCount);
  ImGuiTextBuffer::appendfv(this,fmt,args);
  if ((pIVar2->DebugLogFlags & 0x400) == 0) {
    return;
  }
  pcVar3 = (pIVar2->DebugLogBuf).Buf.Data;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = ImGuiTextBuffer::EmptyString;
  }
  else if ((this->Buf).Size < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                  ,0x70b,"const T &ImVector<char>::front() const [T = char]");
  }
  printf("%s",pcVar3 + iVar4);
  return;
}

Assistant:

void ImGui::DebugLogV(const char* fmt, va_list args)
{
    ImGuiContext& g = *GImGui;
    const int old_size = g.DebugLogBuf.size();
    g.DebugLogBuf.appendf("[%05d] ", g.FrameCount);
    g.DebugLogBuf.appendfv(fmt, args);
    if (g.DebugLogFlags & ImGuiDebugLogFlags_OutputToTTY)
        IMGUI_DEBUG_PRINTF("%s", g.DebugLogBuf.begin() + old_size);
}